

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

Heartbeat *
anon_unknown.dwarf_2926b4::createHeartbeat
          (Heartbeat *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_e8;
  FieldBase local_90;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  Heartbeat *heartbeat;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX42::Heartbeat::Heartbeat(__return_storage_ptr__);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_90,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_90,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_90);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_e8,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_e8,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Heartbeat createHeartbeat(const char *sender, const char *target, int seq) {
  FIX42::Heartbeat heartbeat;
  fillHeader(heartbeat.getHeader(), sender, target, seq);
  heartbeat.getHeader().setField(BodyLength(heartbeat.bodyLength()));
  heartbeat.getTrailer().setField(CheckSum(heartbeat.checkSum()));
  return heartbeat;
}